

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals2
          (SPxSolverBase<double> *this,int leaveIdx,double enterMax,double *leavebound,
          StableSum<double> *objChange)

{
  bool bVar1;
  Status SVar2;
  DataKey *pDVar3;
  undefined8 uVar4;
  Status *pSVar5;
  double *pdVar6;
  SPxInternalCodeException *this_00;
  StableSum<double> *in_RCX;
  double *in_RDX;
  SPxSolverBase<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  Status leaveStat_1;
  Status leaveStat;
  SPxId leftId;
  Desc *ds;
  int idx;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  SPxLPBase<double> *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffce0;
  int i;
  SPxBasisBase<double> *in_stack_fffffffffffffce8;
  allocator local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  Status local_108;
  SPxColId local_104;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [35];
  undefined1 local_85;
  allocator local_71;
  string local_70 [36];
  Status local_4c;
  SPxRowId local_48;
  DataKey local_40;
  Desc *local_38;
  int local_2c;
  StableSum<double> *local_28;
  double *local_20;
  double local_18;
  
  i = (int)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_XMM0_Qa;
  local_38 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  pDVar3 = &SPxBasisBase<double>::baseId
                      ((SPxBasisBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
            ->super_DataKey;
  local_40 = *pDVar3;
  bVar1 = SPxId::isSPxRowId((SPxId *)&local_40);
  if (bVar1) {
    SPxRowId::SPxRowId(&local_48,(SPxId *)&local_40);
    local_2c = SPxLPBase<double>::number
                         (in_stack_fffffffffffffcc0,
                          (SPxRowId *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8))
    ;
    pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    local_4c = *pSVar5;
    switch(local_4c) {
    case D_FREE:
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar7 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc
                        );
      if (0.0 <= dVar7 * local_18) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
      }
      else {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
      }
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      dVar7 = *local_20;
      pdVar6 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = P_FIXED;
      break;
    case D_ON_UPPER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      dVar7 = *local_20;
      pdVar6 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = P_ON_LOWER;
      break;
    case D_ON_LOWER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      dVar7 = *local_20;
      pdVar6 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = P_ON_UPPER;
      break;
    case D_ON_BOTH:
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar7 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc
                        );
      if (0.0 <= local_18 * dVar7) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
        dVar7 = *local_20;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *pdVar6 = dVar7;
        dVar7 = *local_20;
        pdVar6 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
        pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        *pSVar5 = P_ON_UPPER;
      }
      else {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
        dVar7 = *local_20;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *pdVar6 = dVar7;
        dVar7 = *local_20;
        pdVar6 = SPxLPBase<double>::maxRowObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
        pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                           ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        *pSVar5 = P_ON_LOWER;
      }
      break;
    case D_UNDEFINED:
      local_d2 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"XENTER06 This should never happen.",&local_d1);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_d2 = 0;
      __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_FIXED:
      local_85 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"XENTER04 This should never happen.",&local_71);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_85 = 0;
      __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    default:
      local_fa = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"XENTER07 This should never happen.",&local_f9);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_fa = 0;
      __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_ON_LOWER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      SVar2 = SPxBasisBase<double>::dualRowStatus(in_stack_fffffffffffffce8,i);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = SVar2;
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      SVar2 = *pSVar5;
      if (SVar2 == D_ON_UPPER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_LOWER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_BOTH) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      break;
    case P_ON_UPPER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      SVar2 = SPxBasisBase<double>::dualRowStatus(in_stack_fffffffffffffce8,i);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = SVar2;
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      SVar2 = *pSVar5;
      if (SVar2 == D_ON_UPPER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_LOWER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_BOTH) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      break;
    case P_FREE:
      local_aa = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"XENTER05 This should never happen.",&local_a9);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_aa = 0;
      __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[73],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [73])
                      "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
               &local_2c,&local_4c,pSVar5,local_28);
  }
  else {
    SPxColId::SPxColId(&local_104,(SPxId *)&local_40);
    local_2c = SPxLPBase<double>::number
                         (in_stack_fffffffffffffcc0,
                          (SPxColId *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8))
    ;
    pSVar5 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    local_108 = *pSVar5;
    switch(local_108) {
    case D_FREE:
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar7 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc
                        );
      if (dVar7 * local_18 <= 0.0) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
      }
      else {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
      }
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      pdVar6 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      StableSum<double>::operator+=(local_28,*pdVar6 * *local_20);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = P_FIXED;
      break;
    case D_ON_UPPER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      pdVar6 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      StableSum<double>::operator+=(local_28,*pdVar6 * *local_20);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = P_ON_LOWER;
      break;
    case D_ON_LOWER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      pdVar6 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      StableSum<double>::operator+=(local_28,*pdVar6 * *local_20);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = P_ON_UPPER;
      break;
    case D_ON_BOTH:
    case D_UNDEFINED:
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar7 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc
                        );
      if (0.0 <= local_18 * dVar7) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
        dVar7 = *local_20;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *pdVar6 = dVar7;
        pdVar6 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,*pdVar6 * *local_20);
        pSVar5 = SPxBasisBase<double>::Desc::colStatus
                           ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        *pSVar5 = P_ON_LOWER;
      }
      else {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
        dVar7 = *local_20;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *pdVar6 = dVar7;
        pdVar6 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,*pdVar6 * *local_20);
        pSVar5 = SPxBasisBase<double>::Desc::colStatus
                           ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        *pSVar5 = P_ON_UPPER;
      }
      break;
    case P_FIXED:
      local_12a = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"XENTER08 This should never happen.",&local_129);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffcc0,
                 (string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      local_12a = 0;
      __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    default:
      this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"XENTER09 This should never happen.",&local_151);
      SPxInternalCodeException::SPxInternalCodeException
                (this_00,(string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_ON_LOWER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      SVar2 = SPxBasisBase<double>::dualColStatus(in_stack_fffffffffffffce8,i);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = SVar2;
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      SVar2 = *pSVar5;
      if (SVar2 == D_ON_UPPER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_LOWER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_BOTH) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      break;
    case P_ON_UPPER:
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *local_20 = *pdVar6;
      dVar7 = *local_20;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc)
      ;
      *pdVar6 = dVar7;
      SVar2 = SPxBasisBase<double>::dualColStatus(in_stack_fffffffffffffce8,i);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = SVar2;
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      SVar2 = *pSVar5;
      if (SVar2 == D_ON_UPPER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_LOWER) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      else if (SVar2 == D_ON_BOTH) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        dVar7 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        StableSum<double>::operator+=(local_28,dVar7 * *pdVar6);
      }
      break;
    case P_FREE:
      UpdateVector<double>::delta(in_RDI->theFvec);
      dVar7 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc
                        );
      if (dVar7 * local_18 <= 0.0) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
        dVar7 = *local_20;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *pdVar6 = dVar7;
      }
      else {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *local_20 = *pdVar6;
        dVar7 = *local_20;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffcc0,
                            in_stack_fffffffffffffcbc);
        *pdVar6 = dVar7;
      }
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
      *pSVar5 = D_UNDEFINED;
    }
    pSVar5 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[73],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [73])
                      "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
               &local_2c,&local_108,pSVar5,local_28);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals2
(
   int leaveIdx,
   R enterMax,
   R& leavebound,
   StableSum<R>& objChange
)
{
   int idx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   SPxId leftId = this->baseId(leaveIdx);

   if(leftId.isSPxRowId())
   {
      idx = this->number(SPxRowId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER04 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
#if 1
         throw SPxInternalCodeException("XENTER05 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER98 ERROR: not yet debugged!" << std::endl;)

         if((*theCoPvec)[leaveIdx] - theLBbound[leaveIdx] <
               theUBbound[leaveIdx] - (*theCoPvec)[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
         }

         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);
         throw SPxInternalCodeException("XENTER06 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax < 0)
            leavebound = theUBbound[leaveIdx];
         else
            leavebound = theLBbound[leaveIdx];

         theLRbound[idx] = leavebound;
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER07 This should never happen.");
      }

      SPxOut::debug(this, "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(leftId.isSPxColId());
      idx = this->number(SPxColId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
         }

         ds.colStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER08 This should never happen.");
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
            leavebound = theLBbound[leaveIdx];
         else
            leavebound = theUBbound[leaveIdx];

         theUCbound[idx] =
            theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER09 This should never happen.");
      }

      SPxOut::debug(this, "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.colStatus(idx), objChange);
   }
}